

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O0

void CB_ALGS::learn_eval(cb *data,single_learner *param_2,example *ec)

{
  float fVar1;
  cb_class *pcVar2;
  size_t sVar3;
  wclass *pwVar4;
  long in_RDX;
  label *in_RDI;
  size_t i;
  cb_to_cs *c;
  label ld;
  label *in_stack_00000168;
  label *in_stack_00000170;
  example *in_stack_00000178;
  cb_to_cs *in_stack_00000180;
  ulong local_50;
  label *plVar5;
  undefined1 local_40 [8];
  v_array<CB::cb_class> vStack_38;
  long local_18;
  label *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  memcpy(local_40,(void *)(in_RDX + 0x6828),0x28);
  plVar5 = local_8;
  pcVar2 = GEN_CS::get_observed_cost(local_8);
  plVar5[2].costs.end_array = pcVar2;
  GEN_CS::gen_cs_example<true>
            (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
  local_50 = 0;
  while( true ) {
    sVar3 = v_array<CB::cb_class>::size(&vStack_38);
    if (sVar3 <= local_50) break;
    pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[]
                       ((v_array<COST_SENSITIVE::wclass> *)&local_8[2].costs.erase_count,local_50);
    fVar1 = pwVar4->partial_prediction;
    pcVar2 = v_array<CB::cb_class>::operator[](&vStack_38,local_50);
    pcVar2->partial_prediction = fVar1;
    local_50 = local_50 + 1;
  }
  *(undefined4 *)(local_18 + 0x6850) = *(undefined4 *)(local_18 + 0x6828);
  return;
}

Assistant:

void learn_eval(cb& data, single_learner&, example& ec)
{
  CB_EVAL::label ld = ec.l.cb_eval;

  cb_to_cs& c = data.cbcs;
  c.known_cost = get_observed_cost(ld.event);
  gen_cs_example<true>(c, ec, ld.event, data.cb_cs_ld);

  for (size_t i = 0; i < ld.event.costs.size(); i++)
    ld.event.costs[i].partial_prediction = data.cb_cs_ld.costs[i].partial_prediction;

  ec.pred.multiclass = ec.l.cb_eval.action;
}